

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

int __thiscall
cmGlobalGenerator::Build
          (cmGlobalGenerator *this,int jobs,string *param_2,string *bindir,string *projectName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *targets,ostream *ostr,string *makeCommandCSTR,string *config,cmBuildOptions *buildOptions
          ,bool verbose,cmDuration timeout,OutputOption outputflag,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *nativeOptions)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  bool bVar2;
  int __errnum;
  uint uVar3;
  ostream *poVar4;
  ulong uVar5;
  reference pvVar6;
  GeneratedMakeCommand *pGVar7;
  size_type sVar8;
  cmake *this_00;
  cmState *this_01;
  pointer command_00;
  long lVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3d8;
  string local_358;
  rep local_338;
  __normal_iterator<cmGlobalGenerator::GeneratedMakeCommand_*,_std::vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>_>
  local_330;
  __normal_iterator<cmGlobalGenerator::GeneratedMakeCommand_*,_std::vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>_>
  local_328;
  string local_320;
  string local_300;
  __normal_iterator<cmGlobalGenerator::GeneratedMakeCommand_*,_std::vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>_>
  local_2e0;
  __normal_iterator<cmGlobalGenerator::GeneratedMakeCommand_*,_std::vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>_>
  local_2d8;
  iterator command;
  string buildOutput;
  string local_2a8 [6];
  bool needBuildOutput;
  bool isWatcomWMake;
  string outputMakeCommandStr;
  string makeCommandStr;
  string local_260;
  rep local_240;
  cmListFileBacktrace local_238;
  allocator<char> local_219;
  string local_218;
  string local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1bb;
  undefined1 local_1ba;
  allocator<char> local_1b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  iterator local_190;
  size_type local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_180;
  undefined1 local_168 [8];
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  cleanCommand;
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  makeCommand;
  string *outputPtr;
  string outputBuffer;
  string local_108 [4];
  int retVal;
  string local_e8 [8];
  string realConfig;
  char *local_c0;
  undefined1 local_b8 [8];
  string err;
  undefined1 local_88 [8];
  cmWorkingDirectory workdir;
  bool hideconsole;
  bool verbose_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *targets_local;
  string *projectName_local;
  string *bindir_local;
  string *param_2_local;
  int jobs_local;
  cmGlobalGenerator *this_local;
  cmDuration timeout_local;
  
  workdir._39_1_ = verbose;
  workdir._38_1_ = cmSystemTools::GetRunCommandHideConsole();
  cmWorkingDirectory::cmWorkingDirectory((cmWorkingDirectory *)local_88,bindir);
  poVar4 = std::operator<<(ostr,"Change Dir: \'");
  poVar4 = std::operator<<(poVar4,(string *)bindir);
  poVar4 = std::operator<<(poVar4,'\'');
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  bVar1 = cmWorkingDirectory::Failed((cmWorkingDirectory *)local_88);
  if (bVar1) {
    cmSystemTools::SetRunCommandHideConsole((bool)(workdir._38_1_ & 1));
    __errnum = cmWorkingDirectory::GetLastResult((cmWorkingDirectory *)local_88);
    local_c0 = strerror(__errnum);
    cmStrCat<char_const(&)[29],char*>
              ((string *)local_b8,(char (*) [29])"Failed to change directory: ",&local_c0);
    cmSystemTools::Error((string *)local_b8);
    poVar4 = std::operator<<(ostr,(string *)local_b8);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    timeout_local.__r._4_4_ = 1;
    realConfig.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_b8);
    goto LAB_007b0764;
  }
  std::__cxx11::string::string(local_e8,(string *)config);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    (*this->_vptr_cmGlobalGenerator[0x27])(local_108);
    std::__cxx11::string::operator=(local_e8,local_108);
    std::__cxx11::string::~string(local_108);
  }
  outputBuffer.field_2._12_4_ = 0;
  cmSystemTools::SetRunCommandHideConsole(true);
  std::__cxx11::string::string((string *)&outputPtr);
  (*this->_vptr_cmGlobalGenerator[0x15])
            (&cleanCommand.
              super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,this,makeCommandCSTR,projectName,
             bindir,targets,local_e8,jobs,(byte)workdir._39_1_ & 1,buildOptions,nativeOptions);
  if ((outputflag == OUTPUT_PASSTHROUGH) &&
     (pvVar6 = std::
               vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
               ::back((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                       *)&cleanCommand.
                          super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage),
     ((pvVar6->super_GeneratedMakeCommand).RequiresOutputForward & 1U) != 0)) {
    outputflag = OUTPUT_FORWARD;
  }
  if ((buildOptions->Clean & 1U) == 0) {
LAB_007b027d:
    std::__cxx11::string::string((string *)(outputMakeCommandStr.field_2._M_local_buf + 8));
    std::__cxx11::string::string(local_2a8);
    this_01 = cmake::GetState(this->CMakeInstance);
    bVar1 = cmState::UseWatcomWMake(this_01);
    std::__cxx11::string::string((string *)&command);
    std::operator<<(ostr,"\nRun Build Command(s): ");
    outputBuffer.field_2._12_4_ = 0;
    local_2d8._M_current =
         (GeneratedMakeCommand *)
         std::
         vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
         ::begin((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                  *)&cleanCommand.
                     super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    while( true ) {
      local_2e0._M_current =
           (GeneratedMakeCommand *)
           std::
           vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
           ::end((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                  *)&cleanCommand.
                     super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar2 = __gnu_cxx::operator!=(&local_2d8,&local_2e0);
      if (!bVar2 || outputBuffer.field_2._12_4_ != 0) break;
      pGVar7 = &__gnu_cxx::
                __normal_iterator<cmGlobalGenerator::GeneratedMakeCommand_*,_std::vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>_>
                ::operator->(&local_2d8)->super_GeneratedMakeCommand;
      detail::GeneratedMakeCommand::Printable_abi_cxx11_(&local_300,pGVar7);
      std::__cxx11::string::operator=
                ((string *)(outputMakeCommandStr.field_2._M_local_buf + 8),(string *)&local_300);
      std::__cxx11::string::~string((string *)&local_300);
      pGVar7 = &__gnu_cxx::
                __normal_iterator<cmGlobalGenerator::GeneratedMakeCommand_*,_std::vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>_>
                ::operator->(&local_2d8)->super_GeneratedMakeCommand;
      detail::GeneratedMakeCommand::QuotedPrintable_abi_cxx11_(&local_320,pGVar7);
      std::__cxx11::string::operator=(local_2a8,(string *)&local_320);
      std::__cxx11::string::~string((string *)&local_320);
      local_328 = __gnu_cxx::
                  __normal_iterator<cmGlobalGenerator::GeneratedMakeCommand_*,_std::vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>_>
                  ::operator+(&local_2d8,1);
      local_330._M_current =
           (GeneratedMakeCommand *)
           std::
           vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
           ::end((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                  *)&cleanCommand.
                     super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar2 = __gnu_cxx::operator!=(&local_328,&local_330);
      if (bVar2) {
        std::__cxx11::string::operator+=
                  ((string *)(outputMakeCommandStr.field_2._M_local_buf + 8)," && ");
        std::__cxx11::string::operator+=(local_2a8," && ");
      }
      poVar4 = std::operator<<(ostr,local_2a8);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      command_00 = __gnu_cxx::
                   __normal_iterator<cmGlobalGenerator::GeneratedMakeCommand_*,_std::vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>_>
                   ::operator->(&local_2d8);
      local_338 = timeout.__r;
      bVar2 = cmSystemTools::RunSingleCommand
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)command_00,(string *)&outputPtr,(string *)&outputPtr,
                         (int *)(outputBuffer.field_2._M_local_buf + 0xc),(char *)0x0,outputflag,
                         timeout,Auto);
      if (!bVar2) {
        cmSystemTools::SetRunCommandHideConsole((bool)(workdir._38_1_ & 1));
        cmStrCat<char_const(&)[56],std::__cxx11::string&>
                  (&local_358,(char (*) [56])0xfdcc30,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&outputMakeCommandStr.field_2 + 8));
        cmSystemTools::Error(&local_358);
        std::__cxx11::string::~string((string *)&local_358);
        poVar4 = std::operator<<(ostr,(string *)&outputPtr);
        poVar4 = std::operator<<(poVar4,"\nGenerator: execution of make failed. Make command was: ")
        ;
        poVar4 = std::operator<<(poVar4,local_2a8);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        timeout_local.__r._4_4_ = 1;
        goto LAB_007b06cc;
      }
      poVar4 = std::operator<<(ostr,(string *)&outputPtr);
      std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
      if (bVar1) {
        std::__cxx11::string::operator+=((string *)&command,(string *)&outputPtr);
      }
      __gnu_cxx::
      __normal_iterator<cmGlobalGenerator::GeneratedMakeCommand_*,_std::vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>_>
      ::operator++(&local_2d8);
    }
    std::ostream::operator<<(ostr,std::endl<char,std::char_traits<char>>);
    cmSystemTools::SetRunCommandHideConsole((bool)(workdir._38_1_ & 1));
    if (((bVar1) && (outputBuffer.field_2._12_4_ == 0)) &&
       (lVar9 = std::__cxx11::string::find((char *)&command,0xfdcc68), lVar9 != -1)) {
      outputBuffer.field_2._12_4_ = 1;
    }
    timeout_local.__r._4_4_ = outputBuffer.field_2._12_4_;
LAB_007b06cc:
    realConfig.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)&command);
    std::__cxx11::string::~string(local_2a8);
    std::__cxx11::string::~string((string *)(outputMakeCommandStr.field_2._M_local_buf + 8));
  }
  else {
    local_1ba = 1;
    local_1b8 = &local_1b0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"clean",&local_1b9);
    local_1ba = 0;
    local_190 = &local_1b0;
    local_188 = 1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_1bb);
    __l._M_len = local_188;
    __l._M_array = local_190;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_180,__l,&local_1bb);
    uVar3 = (uint)(byte)workdir._39_1_;
    local_1d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1d8);
    (*this->_vptr_cmGlobalGenerator[0x15])
              (local_168,this,makeCommandCSTR,projectName,bindir,&local_180,local_e8,jobs,uVar3 & 1,
               buildOptions,&local_1d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_180);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_1bb);
    local_3d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_190;
    do {
      local_3d8 = local_3d8 + -1;
      std::__cxx11::string::~string((string *)local_3d8);
    } while (local_3d8 != &local_1b0);
    std::allocator<char>::~allocator(&local_1b9);
    poVar4 = std::operator<<(ostr,"\nRun Clean Command: ");
    pGVar7 = &std::
              vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
              ::front((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                       *)local_168)->super_GeneratedMakeCommand;
    detail::GeneratedMakeCommand::QuotedPrintable_abi_cxx11_(&local_1f8,pGVar7);
    poVar4 = std::operator<<(poVar4,(string *)&local_1f8);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_1f8);
    sVar8 = std::
            vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
            ::size((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                    *)local_168);
    if (sVar8 == 1) {
      pvVar6 = std::
               vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
               ::front((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                        *)local_168);
      local_240 = timeout.__r;
      bVar1 = cmSystemTools::RunSingleCommand
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)pvVar6,(string *)&outputPtr,(string *)&outputPtr,
                         (int *)(outputBuffer.field_2._M_local_buf + 0xc),(char *)0x0,outputflag,
                         timeout,Auto);
      if (bVar1) {
        std::operator<<(ostr,(string *)&outputPtr);
        realConfig.field_2._12_4_ = 0;
      }
      else {
        cmSystemTools::SetRunCommandHideConsole((bool)(workdir._38_1_ & 1));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_260,"Generator: execution of make clean failed.",
                   (allocator<char> *)(makeCommandStr.field_2._M_local_buf + 0xf));
        cmSystemTools::Error(&local_260);
        std::__cxx11::string::~string((string *)&local_260);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(makeCommandStr.field_2._M_local_buf + 0xf));
        poVar4 = std::operator<<(ostr,(string *)&outputPtr);
        poVar4 = std::operator<<(poVar4,"\nGenerator: execution of make clean failed.");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        timeout_local.__r._4_4_ = 1;
        realConfig.field_2._12_4_ = 1;
      }
    }
    else {
      this_00 = GetCMakeInstance(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_218,
                 "The generator did not produce exactly one command for the \'clean\' target",
                 &local_219);
      local_238.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_238.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cmListFileBacktrace::cmListFileBacktrace(&local_238);
      cmake::IssueMessage(this_00,INTERNAL_ERROR,&local_218,&local_238);
      cmListFileBacktrace::~cmListFileBacktrace(&local_238);
      std::__cxx11::string::~string((string *)&local_218);
      std::allocator<char>::~allocator(&local_219);
      timeout_local.__r._4_4_ = 1;
      realConfig.field_2._12_4_ = 1;
    }
    std::
    vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
    ::~vector((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
               *)local_168);
    if (realConfig.field_2._12_4_ == 0) goto LAB_007b027d;
  }
  std::
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  ::~vector((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
             *)&cleanCommand.
                super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&outputPtr);
  std::__cxx11::string::~string(local_e8);
LAB_007b0764:
  cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)local_88);
  return timeout_local.__r._4_4_;
}

Assistant:

int cmGlobalGenerator::Build(
  int jobs, const std::string& /*unused*/, const std::string& bindir,
  const std::string& projectName, const std::vector<std::string>& targets,
  std::ostream& ostr, const std::string& makeCommandCSTR,
  const std::string& config, const cmBuildOptions& buildOptions, bool verbose,
  cmDuration timeout, cmSystemTools::OutputOption outputflag,
  std::vector<std::string> const& nativeOptions)
{
  bool hideconsole = cmSystemTools::GetRunCommandHideConsole();

  /**
   * Run an executable command and put the stdout in output.
   */
  cmWorkingDirectory workdir(bindir);
  ostr << "Change Dir: '" << bindir << '\'' << std::endl;
  if (workdir.Failed()) {
    cmSystemTools::SetRunCommandHideConsole(hideconsole);
    std::string err = cmStrCat("Failed to change directory: ",
                               std::strerror(workdir.GetLastResult()));
    cmSystemTools::Error(err);
    ostr << err << std::endl;
    return 1;
  }
  std::string realConfig = config;
  if (realConfig.empty()) {
    realConfig = this->GetDefaultBuildConfig();
  }

  int retVal = 0;
  cmSystemTools::SetRunCommandHideConsole(true);
  std::string outputBuffer;
  std::string* outputPtr = &outputBuffer;

  std::vector<GeneratedMakeCommand> makeCommand = this->GenerateBuildCommand(
    makeCommandCSTR, projectName, bindir, targets, realConfig, jobs, verbose,
    buildOptions, nativeOptions);

  // Workaround to convince some commands to produce output.
  if (outputflag == cmSystemTools::OUTPUT_PASSTHROUGH &&
      makeCommand.back().RequiresOutputForward) {
    outputflag = cmSystemTools::OUTPUT_FORWARD;
  }

  // should we do a clean first?
  if (buildOptions.Clean) {
    std::vector<GeneratedMakeCommand> cleanCommand =
      this->GenerateBuildCommand(makeCommandCSTR, projectName, bindir,
                                 { "clean" }, realConfig, jobs, verbose,
                                 buildOptions);
    ostr << "\nRun Clean Command: " << cleanCommand.front().QuotedPrintable()
         << std::endl;
    if (cleanCommand.size() != 1) {
      this->GetCMakeInstance()->IssueMessage(MessageType::INTERNAL_ERROR,
                                             "The generator did not produce "
                                             "exactly one command for the "
                                             "'clean' target");
      return 1;
    }
    if (!cmSystemTools::RunSingleCommand(cleanCommand.front().PrimaryCommand,
                                         outputPtr, outputPtr, &retVal,
                                         nullptr, outputflag, timeout)) {
      cmSystemTools::SetRunCommandHideConsole(hideconsole);
      cmSystemTools::Error("Generator: execution of make clean failed.");
      ostr << *outputPtr << "\nGenerator: execution of make clean failed."
           << std::endl;

      return 1;
    }
    ostr << *outputPtr;
  }

  // now build
  std::string makeCommandStr;
  std::string outputMakeCommandStr;
  bool isWatcomWMake = this->CMakeInstance->GetState()->UseWatcomWMake();
  bool needBuildOutput = isWatcomWMake;
  std::string buildOutput;
  ostr << "\nRun Build Command(s): ";

  retVal = 0;
  for (auto command = makeCommand.begin();
       command != makeCommand.end() && retVal == 0; ++command) {
    makeCommandStr = command->Printable();
    outputMakeCommandStr = command->QuotedPrintable();
    if ((command + 1) != makeCommand.end()) {
      makeCommandStr += " && ";
      outputMakeCommandStr += " && ";
    }

    ostr << outputMakeCommandStr << std::endl;
    if (!cmSystemTools::RunSingleCommand(command->PrimaryCommand, outputPtr,
                                         outputPtr, &retVal, nullptr,
                                         outputflag, timeout)) {
      cmSystemTools::SetRunCommandHideConsole(hideconsole);
      cmSystemTools::Error(
        cmStrCat("Generator: execution of make failed. Make command was: ",
                 makeCommandStr));
      ostr << *outputPtr
           << "\nGenerator: execution of make failed. Make command was: "
           << outputMakeCommandStr << std::endl;

      return 1;
    }
    ostr << *outputPtr << std::flush;
    if (needBuildOutput) {
      buildOutput += *outputPtr;
    }
  }
  ostr << std::endl;
  cmSystemTools::SetRunCommandHideConsole(hideconsole);

  // The OpenWatcom tools do not return an error code when a link
  // library is not found!
  if (isWatcomWMake && retVal == 0 &&
      buildOutput.find("W1008: cannot open") != std::string::npos) {
    retVal = 1;
  }

  return retVal;
}